

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

char * alloc_string(char *in)

{
  char *pcVar1;
  char *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  lodepng_strlen(in_RDI);
  pcVar1 = alloc_string_sized(in_RDI,in_stack_ffffffffffffffe8);
  return pcVar1;
}

Assistant:

static char* alloc_string(const char* in) {
  return alloc_string_sized(in, lodepng_strlen(in));
}